

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

Integer pnga_inquire_memory(void)

{
  Integer IVar1;
  long lVar2;
  C_Long *pCVar3;
  
  lVar2 = (long)_max_global_array;
  if (0 < lVar2) {
    pCVar3 = &GA->size;
    IVar1 = 0;
    do {
      if (*(int *)(pCVar3 + -1) != 0) {
        IVar1 = IVar1 + *pCVar3;
      }
      pCVar3 = pCVar3 + 0x6d;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    return IVar1;
  }
  return 0;
}

Assistant:

Integer pnga_inquire_memory()
{
Integer i, sum=0;
    for(i=0; i<_max_global_array; i++) 
        if(GA[i].actv) sum += (Integer)GA[i].size; 
    return(sum);
}